

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O2

void usage(char *message)

{
  char *__format;
  
  __format = "%s: %s\n";
  if (*message == '-') {
    __format = "%s: unrecognized option \'%s\'\n";
  }
  fprintf(_stderr,__format,progname,message);
  fprintf(_stderr,
          "usage: %s [options] [filenames]\nAvailable options are:\n  -l       list (use -l -l for full listing)\n  -o name  output to file \'name\' (default is \"%s\")\n  -p       parse only\n  -s       strip debug information\n  -v       show version information\n  --       stop handling options\n  -        stop handling options and process stdin\n"
          ,progname,Output);
  exit(1);
}

Assistant:

static void usage(const char *message) {
    if (*message == '-')
        fprintf(stderr, "%s: unrecognized option '%s'\n", progname, message);
    else
        fprintf(stderr, "%s: %s\n", progname, message);
    fprintf(stderr,
            "usage: %s [options] [filenames]\n"
                    "Available options are:\n"
                    "  -l       list (use -l -l for full listing)\n"
                    "  -o name  output to file 'name' (default is \"%s\")\n"
                    "  -p       parse only\n"
                    "  -s       strip debug information\n"
                    "  -v       show version information\n"
                    "  --       stop handling options\n"
                    "  -        stop handling options and process stdin\n", progname, Output);
    exit(EXIT_FAILURE);
}